

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcole.c
# Opt level: O3

int fffr4r4(float *input,long ntodo,double scale,double zero,int nullcheck,float nullval,
           char *nullarray,int *anynull,float *output,int *status)

{
  ushort uVar1;
  char cVar2;
  long lVar3;
  float fVar4;
  
  if (nullcheck == 0) {
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      if (0 < ntodo) {
        lVar3 = 0;
        do {
          output[lVar3] = (float)((double)input[lVar3] * scale + zero);
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
    }
    else {
      memmove(output,input,ntodo << 2);
    }
  }
  else if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    if (0 < ntodo) {
      lVar3 = 0;
      do {
        uVar1 = *(ushort *)((long)input + lVar3 * 4 + 2);
        cVar2 = ((uVar1 & 0x7f80) == 0) * '\x02';
        if ((uVar1 & 0x7f80) == 0x7f80) {
          cVar2 = '\x01';
        }
        if (cVar2 == '\0') {
          fVar4 = (float)((double)input[lVar3] * scale + zero);
        }
        else {
          fVar4 = (float)zero;
          if ((cVar2 == '\x01') && (*anynull = 1, fVar4 = nullval, nullcheck != 1)) {
            nullarray[lVar3] = '\x01';
            fVar4 = -9.11912e-36;
          }
        }
        output[lVar3] = fVar4;
        lVar3 = lVar3 + 1;
      } while (ntodo != lVar3);
    }
  }
  else if (0 < ntodo) {
    lVar3 = 0;
    do {
      uVar1 = *(ushort *)((long)input + lVar3 * 4 + 2);
      cVar2 = ((uVar1 & 0x7f80) == 0) * '\x02';
      if ((uVar1 & 0x7f80) == 0x7f80) {
        cVar2 = '\x01';
      }
      if (cVar2 == '\0') {
        fVar4 = input[lVar3];
      }
      else {
        fVar4 = 0.0;
        if ((cVar2 == '\x01') && (*anynull = 1, fVar4 = nullval, nullcheck != 1)) {
          nullarray[lVar3] = '\x01';
          fVar4 = -9.11912e-36;
        }
      }
      output[lVar3] = fVar4;
      lVar3 = lVar3 + 1;
    } while (ntodo != lVar3);
  }
  return *status;
}

Assistant:

int fffr4r4(float *input,         /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            float nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            float *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            memmove(output, input, ntodo * sizeof(float) );
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                output[ii] = (float) (input[ii] * scale + zero);
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr++;       /* point to MSBs */
#endif

        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                    {
                        nullarray[ii] = 1;
                       /* explicitly set value in case output contains a NaN */
                        output[ii] = FLOATNULLVALUE;
                    }
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                output[ii] = input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                    {
                        nullarray[ii] = 1;
                       /* explicitly set value in case output contains a NaN */
                        output[ii] = FLOATNULLVALUE;
                    }
                  }
                  else            /* it's an underflow */
                     output[ii] = (float) zero;
              }
              else
                  output[ii] = (float) (input[ii] * scale + zero);
            }
        }
    }
    return(*status);
}